

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ScriptSession::evalExpression(ScriptSession *this,ExpressionSyntax *expr)

{
  LookupLocation lookupLocation;
  int iVar1;
  EvalContext *context_00;
  undefined4 extraout_var;
  Expression *in_RDX;
  bitmask<slang::ast::ASTFlags> in_RSI;
  Scope *in_RDI;
  Expression *bound;
  ASTContext context;
  ASTContext *in_stack_ffffffffffffff68;
  Scope *pSVar2;
  bitmask<slang::ast::ASTFlags> local_78;
  undefined8 local_70;
  bitmask<slang::ast::ASTFlags> local_68;
  undefined8 local_60;
  undefined8 local_58;
  sockaddr local_50 [3];
  Expression *local_18;
  
  context_00 = (EvalContext *)(*(long *)(in_RSI.m_bits + 0xc88) + 0x40);
  local_60 = LookupLocation::max;
  local_58 = DAT_00d8a540;
  pSVar2 = in_RDI;
  local_18 = in_RDX;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_68,None);
  lookupLocation._8_8_ = pSVar2;
  lookupLocation.scope = in_RDI;
  ASTContext::ASTContext(in_stack_ffffffffffffff68,(Scope *)context_00,lookupLocation,in_RSI);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_78,AssignmentAllowed);
  iVar1 = Expression::bind((int)local_18,local_50,(socklen_t)local_78.m_bits);
  local_70 = CONCAT44(extraout_var,iVar1);
  Expression::eval(local_18,context_00);
  return (ConstantValue *)pSVar2;
}

Assistant:

ConstantValue ScriptSession::evalExpression(const ExpressionSyntax& expr) {
    ASTContext context(scope, LookupLocation::max);
    auto& bound = Expression::bind(expr, context, ASTFlags::AssignmentAllowed);
    return bound.eval(evalContext);
}